

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O3

vec3 dja::cross(vec3 *a,vec3 *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vec3 vVar5;
  
  uVar1 = a->y;
  uVar3 = a->z;
  uVar2 = b->y;
  uVar4 = b->z;
  vVar5.x = (float)uVar4 * (float)uVar1 - (float)uVar3 * (float)uVar2;
  vVar5.y = b->x * (float)uVar3 - a->x * (float)uVar4;
  vVar5.z = a->x * (float)uVar2 - b->x * (float)uVar1;
  return vVar5;
}

Assistant:

V3 cross(const V3& a, const V3& b) {
    return vec3(a.y * b.z - a.z * b.y,
                a.z * b.x - a.x * b.z,
                a.x * b.y - a.y * b.x);
}